

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O3

int wally_base58_from_bytes(uchar *bytes,size_t bytes_len,uint32_t flags,char **output)

{
  byte *pbVar1;
  undefined4 *dest;
  char *pcVar2;
  ulong uVar3;
  uchar *puVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  byte *pbVar11;
  uint uVar12;
  undefined4 *puVar13;
  byte *pbVar14;
  ulong __n;
  size_t len;
  uint32_t checksum;
  uchar bn_buf [512];
  undefined4 local_23c;
  undefined4 local_238 [130];
  
  iVar8 = -2;
  if ((output == (char **)0x0) ||
     (*output = (char *)0x0, 1 < flags || (bytes_len == 0 || bytes == (uchar *)0x0)))
  goto LAB_00158a72;
  if (flags == 0) {
    puVar13 = (undefined4 *)0x0;
    uVar9 = bytes_len;
LAB_00158a1f:
    __n = 0;
    do {
      puVar4 = (uchar *)((long)puVar13 - bytes_len);
      if (__n < bytes_len) {
        puVar4 = bytes;
      }
      if (puVar4[__n] != '\0') goto LAB_001589c2;
      __n = __n + 1;
    } while (uVar9 != __n);
  }
  else {
    wally_sha256d(bytes,bytes_len,(uchar *)local_238,0x20);
    wally_clear(local_238,0x20);
    puVar13 = &local_23c;
    local_23c = local_238[0];
    uVar9 = bytes_len + 4;
    if (bytes_len + 4 != 0) goto LAB_00158a1f;
    uVar9 = 0;
    __n = 0;
LAB_001589c2:
    if (uVar9 - __n != 0) {
      uVar3 = (uVar9 - __n) * 0x8a;
      uVar7 = uVar3 / 100;
      if (uVar3 < 0xc800) {
        dest = local_238;
      }
      else {
        dest = (undefined4 *)wally_malloc(uVar7 + 1);
        if (dest == (undefined4 *)0x0) {
          return -3;
        }
      }
      pbVar1 = (byte *)((long)dest + uVar7);
      *(undefined1 *)((long)dest + uVar7) = 0;
      uVar3 = __n;
      pbVar14 = pbVar1;
      if (__n < uVar9) {
        do {
          if (pbVar14 <= pbVar1) {
            pbVar11 = (byte *)((long)puVar13 + (uVar3 - bytes_len));
            if (uVar3 < bytes_len) {
              pbVar11 = bytes + uVar3;
            }
            uVar10 = (uint)*pbVar11;
            pbVar11 = pbVar1;
            do {
              uVar12 = (uint)*pbVar11 * 0x100 + uVar10;
              uVar10 = uVar12 / 0x3a;
              *pbVar11 = (char)uVar12 + (char)(uVar12 / 0x3a) * -0x3a;
              if ((pbVar11 == pbVar14) && (0x39 < uVar12)) {
                pbVar14[-1] = 0;
                pbVar14 = pbVar14 + -1;
              }
              pbVar11 = pbVar11 + -1;
            } while (pbVar14 <= pbVar11);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != uVar9);
      }
      lVar6 = 0;
      uVar9 = __n;
      do {
        uVar3 = uVar9;
        lVar5 = lVar6;
        lVar6 = lVar5 + 1;
        if (pbVar1 <= pbVar14 + lVar5) break;
        uVar9 = uVar3 - 1;
      } while (pbVar14[lVar5] == 0);
      len = (long)dest + ((uVar7 - (long)pbVar14) - lVar6) + 2;
      pcVar2 = (char *)wally_malloc((long)dest + (((__n + uVar7) - (long)pbVar14) - lVar6) + 3);
      *output = pcVar2;
      if (pcVar2 == (char *)0x0) {
        iVar8 = -3;
      }
      else {
        memset(pcVar2,0x31,__n);
        if (pbVar14 + lVar5 != (byte *)(uVar7 + 1 + (long)dest)) {
          lVar6 = 0;
          do {
            (*output)[lVar6 + __n] =
                 "123456789ABCDEFGHJKLMNPQRSTUVWXYZabcdefghijkmnopqrstuvwxyz"
                 [pbVar14[lVar5 + lVar6]];
            lVar6 = lVar6 + 1;
          } while (len + (len == 0) != lVar6);
        }
        (*output)[(long)dest + uVar3 + 1 + (uVar7 - (long)pbVar14)] = '\0';
        iVar8 = 0;
      }
      wally_clear(dest,len);
      if (dest == local_238) {
        return iVar8;
      }
      wally_free(dest);
      return iVar8;
    }
  }
  pcVar2 = (char *)wally_malloc(uVar9 + 1);
  *output = pcVar2;
  if (pcVar2 != (char *)0x0) {
    memset(pcVar2,0x31,uVar9);
    (*output)[uVar9] = '\0';
    return 0;
  }
  iVar8 = -3;
LAB_00158a72:
  wally_clear(local_238,0);
  return iVar8;
}

Assistant:

int wally_base58_from_bytes(const unsigned char *bytes, size_t bytes_len,
                            uint32_t flags, char **output)
{
    uint32_t checksum, *cs_p = NULL;
    unsigned char bn_buf[BIGNUM_BYTES];
    unsigned char *bn = bn_buf, *top_byte, *bn_p;
    size_t bn_bytes = 0, zeros, i, orig_len = bytes_len;
    int ret = WALLY_EINVAL;

    if (output)
        *output = NULL;

    if (!bytes || !bytes_len || (flags & ~BASE58_ALL_DEFINED_FLAGS) || !output)
        goto cleanup; /* Invalid argument */

    if (flags & BASE58_FLAG_CHECKSUM) {
        checksum = base58_get_checksum(bytes, bytes_len);
        cs_p = &checksum;
        bytes_len += 4;
    }

#define b(n) (n < orig_len ? bytes[n] : ((unsigned char *)cs_p)[n - orig_len])

    /* Process leading zeros */
    for (zeros = 0; zeros < bytes_len && !b(zeros); ++zeros)
        ; /* no-op*/

    if (zeros == bytes_len) {
        if (!(*output = wally_malloc(zeros + 1))) {
            ret = WALLY_ENOMEM;
            goto cleanup;
        }

        memset(*output, '1', zeros);
        (*output)[zeros] = '\0';
        return WALLY_OK; /* All 0's */
    }

    bn_bytes = (bytes_len - zeros) * 138 / 100 + 1; /* log(256)/log(58) rounded up */

    /* Allocate our bignum buffer if it won't fit on the stack */
    if (bn_bytes > BIGNUM_BYTES)
        if (!(bn = wally_malloc(bn_bytes))) {
            ret = WALLY_ENOMEM;
            goto cleanup;
        }

    top_byte = bn + bn_bytes - 1;
    *top_byte = 0;

    for (i = zeros; i < bytes_len; ++i) {
        uint32_t carry = b(i);
        for (bn_p = bn + bn_bytes - 1; bn_p >= top_byte; --bn_p) {
            carry = *bn_p * 256 + carry;
            *bn_p = carry % 58;
            carry = carry / 58;
            if (carry && bn_p == top_byte)
                *--top_byte = 0; /* Increase bignum size */
        }
    }

    while (!*top_byte && top_byte < bn + bn_bytes - 1)
        ++top_byte; /* Skip leading zero bytes in our bignum */

    /* Copy the result */
    bn_bytes = bn + bn_bytes - top_byte;

    if (!(*output = wally_malloc(zeros + bn_bytes + 1))) {
        ret = WALLY_ENOMEM;
        goto cleanup;
    }

    memset(*output, '1', zeros);
    for (i = 0; i < bn_bytes; ++i)
        (*output)[zeros + i] = byte_to_base58[top_byte[i]];
    (*output)[zeros + bn_bytes] = '\0';

    ret = WALLY_OK;

cleanup:
    if (bn) {
        wally_clear(bn, bn_bytes);
        if (bn != bn_buf)
            wally_free(bn);
    }
    return ret;
#undef b
}